

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O2

uint16_t __thiscall AmsRouter::OpenPort(AmsRouter *this)

{
  bool bVar1;
  uint16_t unaff_BP;
  AmsPort *this_00;
  uint16_t i;
  ulong uVar2;
  
  std::recursive_mutex::lock(&this->mutex);
  this_00 = (AmsPort *)&this->ports;
  uVar2 = 0;
  do {
    if (uVar2 == 0x80) {
LAB_00133234:
      if (0x7f < uVar2) {
        unaff_BP = 0;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
      return unaff_BP;
    }
    bVar1 = AmsPort::IsOpen(this_00);
    if (!bVar1) {
      unaff_BP = AmsPort::Open(this_00,(short)uVar2 + 30000);
      goto LAB_00133234;
    }
    uVar2 = uVar2 + 1;
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

uint16_t AmsRouter::OpenPort()
{
    std::lock_guard<std::recursive_mutex> lock(mutex);

    for (uint16_t i = 0; i < NUM_PORTS_MAX; ++i) {
        if (!ports[i].IsOpen()) {
            return ports[i].Open(PORT_BASE + i);
        }
    }
    return 0;
}